

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::StreamingReporterBase::testRunStarting(StreamingReporterBase *this,TestRunInfo *_testRunInfo)

{
  Option<Catch::TestRunInfo> *in_stack_ffffffffffffffb8;
  Option<Catch::TestRunInfo> *in_stack_ffffffffffffffc0;
  
  Option<Catch::TestRunInfo>::Option
            (in_stack_ffffffffffffffc0,(TestRunInfo *)in_stack_ffffffffffffffb8);
  Option<Catch::TestRunInfo>::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  Option<Catch::TestRunInfo>::~Option((Option<Catch::TestRunInfo> *)0x1a61e9);
  return;
}

Assistant:

virtual void testRunStarting( TestRunInfo const& _testRunInfo ) {
            testRunInfo = _testRunInfo;
        }